

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteLock.cpp
# Opt level: O0

void __thiscall ReadWriteLock::unlock(ReadWriteLock *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> locker;
  ReadWriteLock *this_local;
  
  locker._M_device = &this->mMutex;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mMutex);
  if (this->mCount < 1) {
    __assert_fail("mCount > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/ReadWriteLock.cpp"
                  ,0x30,"void ReadWriteLock::unlock()");
  }
  if (this->mCount < 2) {
    this->mCount = this->mCount + -1;
    if (this->mCount != 0) {
      __assert_fail("!mCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/ReadWriteLock.cpp"
                    ,0x37,"void ReadWriteLock::unlock()");
    }
    this->mWrite = false;
    std::condition_variable::notify_all();
  }
  else {
    this->mCount = this->mCount + -1;
    if (((this->mWrite ^ 0xffU) & 1) == 0) {
      __assert_fail("!mWrite",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/ReadWriteLock.cpp"
                    ,0x33,"void ReadWriteLock::unlock()");
    }
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void ReadWriteLock::unlock()
{
    std::lock_guard<std::mutex> locker(mMutex);
    assert(mCount > 0);
    if (mCount > 1) {
        --mCount;
        assert(!mWrite);
        return;
    }
    --mCount;
    assert(!mCount);
    mWrite = false;
    mCond.notify_all();
}